

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_CreateSecNodeList(AActor *thing)

{
  bool bVar1;
  int iVar2;
  line_t *ld_00;
  double x;
  double y;
  line_t *ld;
  FBlockLinesIterator it;
  FBoundingBox box;
  msecnode_t *node;
  AActor *thing_local;
  
  for (box.m_Box[3] = (double)sector_list; box.m_Box[3] != 0.0;
      box.m_Box[3] = *(double *)((long)box.m_Box[3] + 0x18)) {
    *(undefined8 *)((long)box.m_Box[3] + 8) = 0;
  }
  x = AActor::X(thing);
  y = AActor::Y(thing);
  FBoundingBox::FBoundingBox((FBoundingBox *)&it.list,x,y,thing->radius);
  FBlockLinesIterator::FBlockLinesIterator((FBlockLinesIterator *)&ld,(FBoundingBox *)&it.list);
  while (ld_00 = FBlockLinesIterator::Next((FBlockLinesIterator *)&ld), ld_00 != (line_t *)0x0) {
    bVar1 = FBoundingBox::inRange((FBoundingBox *)&it.list,ld_00);
    if (((bVar1) &&
        (iVar2 = FBoundingBox::BoxOnLineSide((FBoundingBox *)&it.list,ld_00), iVar2 == -1)) &&
       (sector_list = P_AddSecnode(ld_00->frontsector,thing,sector_list,
                                   &ld_00->frontsector->touching_thinglist),
       ld_00->backsector != (sector_t *)0x0)) {
      sector_list = P_AddSecnode(ld_00->backsector,thing,sector_list,
                                 &ld_00->backsector->touching_thinglist);
    }
  }
  sector_list = P_AddSecnode(thing->Sector,thing,sector_list,&thing->Sector->touching_thinglist);
  box.m_Box[3] = (double)sector_list;
  while (box.m_Box[3] != 0.0) {
    if (*(long *)((long)box.m_Box[3] + 8) == 0) {
      if ((msecnode_t *)box.m_Box[3] == sector_list) {
        sector_list = *(msecnode_t **)((long)box.m_Box[3] + 0x18);
      }
      box.m_Box[3] = (double)P_DelSecnode((msecnode_t *)box.m_Box[3],0x1b8);
    }
    else {
      box.m_Box[3] = *(double *)((long)box.m_Box[3] + 0x18);
    }
  }
  return;
}

Assistant:

void P_CreateSecNodeList(AActor *thing)
{
	msecnode_t *node;

	// First, clear out the existing m_thing fields. As each node is
	// added or verified as needed, m_thing will be set properly. When
	// finished, delete all nodes where m_thing is still NULL. These
	// represent the sectors the Thing has vacated.

	node = sector_list;
	while (node)
	{
		node->m_thing = NULL;
		node = node->m_tnext;
	}

	FBoundingBox box(thing->X(), thing->Y(), thing->radius);
	FBlockLinesIterator it(box);
	line_t *ld;

	while ((ld = it.Next()))
	{
		if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
			continue;

		// This line crosses through the object.

		// Collect the sector(s) from the line and add to the
		// sector_list you're examining. If the Thing ends up being
		// allowed to move to this position, then the sector_list
		// will be attached to the Thing's AActor at touching_sectorlist.

		sector_list = P_AddSecnode(ld->frontsector, thing, sector_list, ld->frontsector->touching_thinglist);

		// Don't assume all lines are 2-sided, since some Things
		// like MT_TFOG are allowed regardless of whether their radius takes
		// them beyond an impassable linedef.

		// killough 3/27/98, 4/4/98:
		// Use sidedefs instead of 2s flag to determine two-sidedness.

		if (ld->backsector)
			sector_list = P_AddSecnode(ld->backsector, thing, sector_list, ld->backsector->touching_thinglist);
	}

	// Add the sector of the (x,y) point to sector_list.

	sector_list = P_AddSecnode(thing->Sector, thing, sector_list, thing->Sector->touching_thinglist);

	// Now delete any nodes that won't be used. These are the ones where
	// m_thing is still NULL.

	node = sector_list;
	while (node)
	{
		if (node->m_thing == NULL)
		{
			if (node == sector_list)
				sector_list = node->m_tnext;
			node = P_DelSecnode(node, &sector_t::touching_thinglist);
		}
		else
		{
			node = node->m_tnext;
		}
	}
}